

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WorkerJob.h
# Opt level: O0

void __thiscall
xmrig::WorkerJob<1UL>::nextRound(WorkerJob<1UL> *this,uint32_t rounds,uint32_t roundSize)

{
  uint32_t uVar1;
  char *pcVar2;
  uint32_t *puVar3;
  uint32_t in_EDX;
  int __c;
  uint uVar4;
  char *in_RSI;
  WorkerJob<1UL> *in_RDI;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 uVar5;
  undefined4 in_stack_ffffffffffffffe4;
  uint8_t index;
  
  uVar4 = (uint)in_RSI;
  pcVar2 = WorkerJob<1UL>::index(in_RDI,in_RSI,in_EDX);
  in_RDI->m_rounds[(ulong)pcVar2 & 0xff] = in_RDI->m_rounds[(ulong)pcVar2 & 0xff] + 1;
  pcVar2 = WorkerJob<1UL>::index(in_RDI,in_RSI,__c);
  if (in_RDI->m_rounds[(ulong)pcVar2 & 0xff] % uVar4 == 0) {
    pcVar2 = WorkerJob<1UL>::index(in_RDI,in_RSI,0);
    index = (uint8_t)(uVar4 >> 0x18);
    uVar1 = (uint32_t)((ulong)in_RDI >> 0x20);
    uVar5 = CONCAT13((char)pcVar2,(int3)in_stack_ffffffffffffffe0);
    nonce((WorkerJob<1UL> *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),
          CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    uVar1 = Nonce::next(index,in_EDX,uVar1);
    puVar3 = nonce((WorkerJob<1UL> *)CONCAT44(uVar1,uVar5),
                   CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    *puVar3 = uVar1;
  }
  else {
    puVar3 = nonce((WorkerJob<1UL> *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                   CONCAT44(in_EDX,in_stack_ffffffffffffffd8));
    *puVar3 = in_EDX + *puVar3;
  }
  return;
}

Assistant:

inline void xmrig::WorkerJob<1>::nextRound(uint32_t rounds, uint32_t roundSize)
{
    m_rounds[index()]++;

    if ((m_rounds[index()] % rounds) == 0) {
        *nonce() = Nonce::next(index(), *nonce(), rounds * roundSize);
    }
    else {
        *nonce() += roundSize;
    }
}